

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_tt__GetGlyfOffset(nk_tt_fontinfo *info,int glyph_index)

{
  int iVar1;
  uchar *puVar2;
  nk_uint nVar3;
  nk_uint nVar4;
  int iVar5;
  long lVar6;
  
  iVar5 = -1;
  if ((glyph_index < info->numGlyphs) && (info->indexToLocFormat < 2)) {
    iVar5 = info->loca;
    puVar2 = info->data;
    iVar1 = info->glyf;
    if (info->indexToLocFormat == 0) {
      lVar6 = (long)glyph_index;
      nVar3 = (uint)puVar2[lVar6 * 2 + (long)iVar5] * 0x200 +
              (uint)puVar2[lVar6 * 2 + (long)iVar5 + 1] * 2;
      nVar4 = (uint)puVar2[lVar6 * 2 + (long)iVar5 + 2] * 0x200 +
              (uint)puVar2[lVar6 * 2 + (long)iVar5 + 3] * 2;
    }
    else {
      nVar3 = nk_ttULONG(puVar2 + (long)(glyph_index << 2) + (long)iVar5);
      nVar4 = nk_ttULONG(puVar2 + (long)(glyph_index << 2) + (long)iVar5 + 4);
    }
    iVar5 = -1;
    if (nVar3 != nVar4) {
      iVar5 = iVar1 + nVar3;
    }
  }
  return iVar5;
}

Assistant:

NK_INTERN int
nk_tt__GetGlyfOffset(const struct nk_tt_fontinfo *info, int glyph_index)
{
    int g1,g2;
    if (glyph_index >= info->numGlyphs) return -1; /* glyph index out of range */
    if (info->indexToLocFormat >= 2)    return -1; /* unknown index->glyph map format */

    if (info->indexToLocFormat == 0) {
        g1 = info->glyf + nk_ttUSHORT(info->data + info->loca + glyph_index * 2) * 2;
        g2 = info->glyf + nk_ttUSHORT(info->data + info->loca + glyph_index * 2 + 2) * 2;
    } else {
        g1 = info->glyf + (int)nk_ttULONG (info->data + info->loca + glyph_index * 4);
        g2 = info->glyf + (int)nk_ttULONG (info->data + info->loca + glyph_index * 4 + 4);
    }
    return g1==g2 ? -1 : g1; /* if length is 0, return -1 */
}